

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorShaderInstancer::DecoratorShaderInstancer(DecoratorShaderInstancer *this)

{
  PropertyId PVar1;
  PropertyDefinition *pPVar2;
  allocator<char> local_101;
  String local_100;
  allocator<char> local_d9;
  String local_d8;
  allocator<char> local_b1;
  String local_b0;
  allocator<char> local_89;
  String local_88;
  String local_68;
  allocator<char> local_31;
  String local_30;
  DecoratorShaderInstancer *local_10;
  DecoratorShaderInstancer *this_local;
  
  local_10 = this;
  DecoratorInstancer::DecoratorInstancer(&this->super_DecoratorInstancer);
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorShaderInstancer_00815e30;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"value",&local_31);
  ::std::__cxx11::string::string((string *)&local_68);
  pPVar2 = EffectSpecification::RegisterProperty
                     (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_30,
                      &local_68);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"string",&local_89);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
  pPVar2 = PropertyDefinition::AddParser(pPVar2,&local_88,&local_b0);
  PVar1 = PropertyDefinition::GetId(pPVar2);
  (this->ids).value = PVar1;
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::allocator<char>::~allocator(&local_b1);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"decorator",&local_d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"value",&local_101);
  EffectSpecification::RegisterShorthand
            (&(this->super_DecoratorInstancer).super_EffectSpecification,&local_d8,&local_100,
             FallThrough);
  ::std::__cxx11::string::~string((string *)&local_100);
  ::std::allocator<char>::~allocator(&local_101);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

DecoratorShaderInstancer::DecoratorShaderInstancer()
{
	ids.value = RegisterProperty("value", String()).AddParser("string").GetId();
	RegisterShorthand("decorator", "value", ShorthandType::FallThrough);
}